

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O3

int __thiscall
cmCTestCoverageHandler::RunBullseyeCommand
          (cmCTestCoverageHandler *this,cmCTestCoverageHandlerContainer *cont,char *cmd,char *arg,
          string *outputFile)

{
  cmCTest *pcVar1;
  long *plVar2;
  pointer pcVar3;
  bool bVar4;
  ostream *poVar5;
  size_t sVar6;
  int iVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  pointer pbVar9;
  string stdoutFile;
  string program;
  cmCTestRunProcess runCoverageSrc;
  string stderrFile;
  ostringstream cmCTestLog_msg;
  undefined1 auStack_298 [8];
  long *local_290;
  long local_288;
  long local_280 [2];
  undefined1 local_270 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  pointer local_240;
  pointer local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_200;
  string *local_1f8;
  cmCTestCoverageHandlerContainer *local_1f0;
  long *local_1e8 [2];
  long local_1d8 [2];
  long *local_1c8;
  long local_1b8 [2];
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  local_1a8._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_1a8._8_8_ = (pointer)0x0;
  local_198[0]._M_allocated_capacity = (pointer)0x0;
  cmsys::SystemTools::FindProgram
            ((string *)local_270,cmd,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_1a8,false);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1a8);
  if (local_270._8_8_ == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Cannot find :",0xd);
    if (cmd == (char *)0x0) {
      std::ios::clear((int)auStack_298 + (int)*(undefined8 *)(local_1a8._0_8_ + -0x18) + 0xf0);
    }
    else {
      sVar6 = strlen(cmd);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,cmd,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x78e,(char *)CONCAT44(local_250._M_allocated_capacity._4_4_,
                                         local_250._M_allocated_capacity._0_4_),false);
    if ((pointer *)
        CONCAT44(local_250._M_allocated_capacity._4_4_,local_250._M_allocated_capacity._0_4_) !=
        &local_240) {
      operator_delete((pointer *)
                      CONCAT44(local_250._M_allocated_capacity._4_4_,
                               local_250._M_allocated_capacity._0_4_),
                      (ulong)((long)&(local_240->_M_dataplus)._M_p + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    iVar7 = 0;
  }
  else {
    if (arg == (char *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Run : ",6);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(char *)local_270._0_8_,local_270._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                   ,0x796,(char *)CONCAT44(local_250._M_allocated_capacity._4_4_,
                                           local_250._M_allocated_capacity._0_4_),
                   (this->super_cmCTestGenericHandler).Quiet);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Run : ",6);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(char *)local_270._0_8_,local_270._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      sVar6 = strlen(arg);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,arg,sVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                   ,0x793,(char *)CONCAT44(local_250._M_allocated_capacity._4_4_,
                                           local_250._M_allocated_capacity._0_4_),
                   (this->super_cmCTestGenericHandler).Quiet);
    }
    if ((pointer *)
        CONCAT44(local_250._M_allocated_capacity._4_4_,local_250._M_allocated_capacity._0_4_) !=
        &local_240) {
      operator_delete((pointer *)
                      CONCAT44(local_250._M_allocated_capacity._4_4_,
                               local_250._M_allocated_capacity._0_4_),
                      (ulong)((long)&(local_240->_M_dataplus)._M_p + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    local_1f8 = outputFile;
    local_1f0 = cont;
    cmCTestRunProcess::cmCTestRunProcess((cmCTestRunProcess *)&local_250);
    local_1a8._0_8_ = local_270._0_8_;
    if (local_238 != local_240) {
      paVar8 = &local_240->field_2;
      local_200 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)arg;
      do {
        plVar2 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (paVar8 + -1))->_M_dataplus)._M_p;
        if (paVar8 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)plVar2) {
          operator_delete(plVar2,paVar8->_M_allocated_capacity + 1);
        }
        pbVar9 = (pointer)(paVar8 + 1);
        paVar8 = paVar8 + 2;
      } while (pbVar9 != local_238);
      local_238 = local_240;
      arg = (char *)local_200;
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_240,
               (char **)local_1a8);
    local_1a8._0_8_ = arg;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)arg != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_240,
                 (char **)local_1a8);
    }
    pcVar3 = (local_1f0->BinaryDir)._M_dataplus._M_p;
    local_290 = local_280;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_290,pcVar3,pcVar3 + (local_1f0->BinaryDir)._M_string_length);
    std::__cxx11::string::append((char *)&local_290);
    cmCTest::GetCurrentTag_abi_cxx11_((string *)local_1a8,(this->super_cmCTestGenericHandler).CTest)
    ;
    std::__cxx11::string::_M_append((char *)&local_290,local_1a8._0_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._0_8_ != local_198) {
      operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0]._M_allocated_capacity + 1));
    }
    std::__cxx11::string::append((char *)&local_290);
    std::__cxx11::string::append((char *)&local_290);
    local_1e8[0] = local_1d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1e8,local_290,(long)local_290 + local_288);
    std::__cxx11::string::append((char *)&local_290);
    std::__cxx11::string::append((char *)local_1e8);
    cmsysProcess_SetPipeFile((cmsysProcess *)local_250._8_8_,2,(char *)local_290);
    cmsysProcess_SetPipeFile((cmsysProcess *)local_250._8_8_,3,(char *)local_1e8[0]);
    bVar4 = cmCTestRunProcess::StartProcess((cmCTestRunProcess *)&local_250);
    if (bVar4) {
      local_250._M_allocated_capacity._0_4_ =
           cmsysProcess_WaitForExit((cmsysProcess *)local_250._8_8_,(double *)0x0);
      iVar7 = 1;
      std::__cxx11::string::_M_assign((string *)local_1f8);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Could not run : ",0x10);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(char *)local_270._0_8_,local_270._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)arg == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
        std::ios::clear((int)poVar5 + (int)poVar5->_vptr_basic_ostream[-3]);
      }
      else {
        sVar6 = strlen(arg);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,arg,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"kwsys process state : ",0x16);
      std::ostream::operator<<(poVar5,local_250._M_allocated_capacity._0_4_);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                   ,0x7a9,(char *)local_1c8,false);
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8,local_1b8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      iVar7 = 0;
    }
    if (local_1e8[0] != local_1d8) {
      operator_delete(local_1e8[0],local_1d8[0] + 1);
    }
    if (local_290 != local_280) {
      operator_delete(local_290,local_280[0] + 1);
    }
    cmCTestRunProcess::~cmCTestRunProcess((cmCTestRunProcess *)&local_250);
  }
  if ((pointer)local_270._0_8_ != (pointer)(local_270 + 0x10)) {
    operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
  }
  return iVar7;
}

Assistant:

int cmCTestCoverageHandler::RunBullseyeCommand(
  cmCTestCoverageHandlerContainer* cont, const char* cmd, const char* arg,
  std::string& outputFile)
{
  std::string program = cmSystemTools::FindProgram(cmd);
  if (program.empty()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "Cannot find :" << cmd << "\n");
    return 0;
  }
  if (arg) {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "Run : " << program << " " << arg << "\n", this->Quiet);
  } else {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "Run : " << program << "\n", this->Quiet);
  }
  // create a process object and start it
  cmCTestRunProcess runCoverageSrc;
  runCoverageSrc.SetCommand(program.c_str());
  runCoverageSrc.AddArgument(arg);
  std::string stdoutFile = cont->BinaryDir + "/Testing/Temporary/";
  stdoutFile += this->GetCTestInstance()->GetCurrentTag();
  stdoutFile += "-";
  stdoutFile += cmd;
  std::string stderrFile = stdoutFile;
  stdoutFile += ".stdout";
  stderrFile += ".stderr";
  runCoverageSrc.SetStdoutFile(stdoutFile.c_str());
  runCoverageSrc.SetStderrFile(stderrFile.c_str());
  if (!runCoverageSrc.StartProcess()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Could not run : " << program << " " << arg << "\n"
                                  << "kwsys process state : "
                                  << runCoverageSrc.GetProcessState());
    return 0;
  }
  // since we set the output file names wait for it to end
  runCoverageSrc.WaitForExit();
  outputFile = stdoutFile;
  return 1;
}